

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

size_t secp256k1_context_preallocated_size(uint flags)

{
  undefined8 extraout_RAX;
  size_t sVar1;
  void *in_RSI;
  char *pcVar2;
  undefined8 in_R9;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  if ((char)flags == '\x01') {
    if ((flags >> 10 & 1) == 0) {
      return 200;
    }
  }
  else {
    secp256k1_default_illegal_callback_fn("Invalid flags",in_RSI);
  }
  pcVar2 = "Declassify flag requires running with memory checking";
  secp256k1_default_illegal_callback_fn
            ("Declassify flag requires running with memory checking",in_RSI);
  if ((int *)pcVar2 != (int *)0x0) {
    sVar1 = 200;
    if (*(int *)pcVar2 == 0) {
      (**(code **)((long)pcVar2 + 0xa0))
                ("secp256k1_context_is_proper(ctx)",*(undefined8 *)((long)pcVar2 + 0xa8));
      sVar1 = 0;
    }
    return sVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
          ,0x85,"test condition failed: ctx != NULL",in_R9,extraout_RAX);
  abort();
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = sizeof(secp256k1_context);
    /* A return value of 0 is reserved as an indicator for errors when we call this function internally. */
    VERIFY_CHECK(ret != 0);

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (EXPECT(!SECP256K1_CHECKMEM_RUNNING() && (flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY), 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Declassify flag requires running with memory checking");
            return 0;
    }

    return ret;
}